

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmBase.cpp
# Opt level: O1

void __thiscall AlgorithmBase::AlgorithmBase(AlgorithmBase *this,QObject *parent)

{
  QTimer *this_00;
  undefined4 *puVar1;
  QObject local_50 [8];
  QSlotObjectBase local_48;
  code *local_38;
  undefined8 local_30;
  
  QThread::QThread(&this->super_QThread,parent);
  *(undefined ***)this = &PTR_metaObject_00355f78;
  QImage::QImage(&this->target_);
  QImage::QImage(&this->allRgb_);
  this_00 = &this->iterateTimer_;
  this->iterations_ = 0;
  this->improvements_ = 0;
  QTimer::QTimer(this_00,(QObject *)this);
  QTimer::setSingleShot(SUB81(this_00,0));
  QTimer::setInterval((int)this_00);
  local_38 = QTimer::timeout;
  local_30 = 0;
  local_48.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x79;
  local_48._4_4_ = 0;
  local_48.m_impl = (ImplFn)0x0;
  puVar1 = (undefined4 *)operator_new(0x20);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) =
       QtPrivate::QSlotObject<void_(AlgorithmBase::*)(),_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar1 + 4) = 0x79;
  *(undefined8 *)(puVar1 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)this_00,(QObject *)&local_38,(void **)this,&local_48,
             (ConnectionType)puVar1,(int *)0x1,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  return;
}

Assistant:

AlgorithmBase::AlgorithmBase(QObject *parent)
    : QThread{parent}
    , iterations_(0)
    , improvements_(0)
    , iterateTimer_(this)
{
    iterateTimer_.setSingleShot(false);
    iterateTimer_.setInterval(0);
    connect(&iterateTimer_, &QTimer::timeout, this, &AlgorithmBase::Iterate, Qt::DirectConnection);
}